

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O3

bool __thiscall
sptk::reaper::EpochTracker::ResampleAndReturnResults
          (EpochTracker *this,float resample_interval,vector<float,_std::allocator<float>_> *f0,
          vector<float,_std::allocator<float>_> *correlations)

{
  int iVar1;
  float fVar2;
  pointer pTVar3;
  pointer pfVar4;
  pointer pfVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  size_type sVar10;
  uint uVar11;
  int iVar12;
  size_type __n;
  float fVar13;
  float fVar14;
  value_type_conflict3 local_38;
  value_type_conflict3 local_34;
  
  if ((0.0 < this->sample_rate_) &&
     (pTVar3 = (this->output_).
               super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->output_).
     super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
     ._M_impl.super__Vector_impl_data._M_finish != pTVar3)) {
    if (resample_interval <= 0.0) {
      ResampleAndReturnResults();
      return false;
    }
    iVar12 = (int)(((float)pTVar3->resid_index / this->sample_rate_ + this->endpoint_padding_) /
                   resample_interval + 0.5);
    std::vector<float,_std::allocator<float>_>::resize(f0,0);
    std::vector<float,_std::allocator<float>_>::resize(correlations,0);
    __n = (size_type)iVar12;
    local_34 = 0.0;
    std::vector<float,_std::allocator<float>_>::_M_fill_insert
              (f0,(iterator)
                  (f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                  super__Vector_impl_data._M_start,__n,&local_34);
    local_38 = 0.0;
    std::vector<float,_std::allocator<float>_>::_M_fill_insert
              (correlations,
               (iterator)
               (correlations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start,__n,&local_38);
    pfVar4 = (correlations->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar3 = (this->output_).
             super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (int)((ulong)((long)(this->output_).
                                super__Vector_base<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) >> 4) - 1
    ;
    fVar13 = pTVar3[(int)uVar8].f0;
    fVar14 = pTVar3[(int)uVar8].nccf_value;
    if ((int)uVar8 < 0) {
      if (iVar12 < 1) {
        return true;
      }
      sVar10 = 0;
    }
    else {
      pfVar5 = (f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (ulong)uVar8;
      uVar8 = 0;
      do {
        uVar11 = (uint)((float)pTVar3[uVar9].resid_index / (this->sample_rate_ * resample_interval)
                       + 0.5);
        if (iVar12 <= (int)uVar11) {
          uVar11 = iVar12 - 1;
        }
        sVar10 = (size_type)(int)uVar11;
        pfVar5[sVar10] = pTVar3[uVar9].f0;
        fVar2 = pTVar3[uVar9].nccf_value;
        pfVar4[sVar10] = fVar2;
        iVar1 = uVar8 + 1;
        if (iVar1 < (int)uVar11 && 1 < (int)(uVar11 - uVar8)) {
          lVar7 = 0;
          do {
            pfVar5[iVar1 + lVar7] = fVar13;
            pfVar4[iVar1 + lVar7] = fVar14;
            lVar7 = lVar7 + 1;
          } while (~uVar8 + uVar11 != (int)lVar7);
          fVar2 = pTVar3[uVar9].nccf_value;
        }
        fVar14 = fVar2;
        fVar13 = pTVar3[uVar9].f0;
        bVar6 = 0 < (long)uVar9;
        uVar9 = uVar9 - 1;
        uVar8 = uVar11;
      } while (bVar6);
    }
    pfVar5 = (f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      pfVar5[sVar10] = fVar13;
      pfVar4[sVar10] = fVar14;
      sVar10 = sVar10 + 1;
    } while (__n != sVar10);
    return true;
  }
  ResampleAndReturnResults();
  return false;
}

Assistant:

bool EpochTracker::ResampleAndReturnResults(float resample_interval,
                                            std::vector<float>* f0,
                                            std::vector<float>* correlations) {
  if ((sample_rate_ <= 0.0) || (output_.size() == 0)) {
    fprintf(stderr, 
            "Un-initialized EpochTracker or no output_ in ResampleAndReturnF0\n");
    return false;
  }
  if (resample_interval <= 0.0) {
    fprintf(stderr, "resample_interval <= 0.0 in ResampleAndReturnF0\n");
    return false;
  }
  float last_time = (output_[0].resid_index / sample_rate_) + endpoint_padding_;
  int32_t n_frames = RoundUp(last_time / resample_interval);
  f0->resize(0);
  correlations->resize(0);
  f0->insert(f0->begin(), n_frames, 0.0);
  correlations->insert(correlations->begin(), n_frames, 0.0);
  int32_t limit = output_.size() - 1;
  int32_t prev_frame = 0;
  float prev_f0 = output_[limit].f0;
  float prev_corr = output_[limit].nccf_value;
  for (int32_t i = limit; i >= 0; --i) {
    int32_t frame = RoundUp(output_[i].resid_index /
                            (sample_rate_ * resample_interval));
#if 1
    if (frame >= n_frames) {
      frame = n_frames - 1;
    }
#endif
    (*f0)[frame] = output_[i].f0;
    (*correlations)[frame] = output_[i].nccf_value;
    if ((frame - prev_frame) > 1) {
      for (int32_t fr = prev_frame + 1; fr < frame; ++fr) {
        (*f0)[fr] = prev_f0;
        (*correlations)[fr] = prev_corr;
      }
    }
    prev_frame = frame;
    prev_corr = output_[i].nccf_value;
    prev_f0 = output_[i].f0;
  }
  for (int32_t frame = prev_frame; frame < n_frames; ++frame) {
    (*f0)[frame] = prev_f0;
    (*correlations)[frame] = prev_corr;
  }
  return true;
}